

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

greatest_test_res inflate_padding(void)

{
  int iVar1;
  uint local_10;
  int res;
  uint dlen;
  
  local_10 = 0;
  iVar1 = tinf_uncompress("",&local_10,inflate_padding::data,2);
  greatest_info.assertions = greatest_info.assertions + 1;
  if ((iVar1 == 0) && (local_10 == 0)) {
    greatest_info.msg = (char *)0x0;
    res = 0;
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
    greatest_info.fail_line = 0xbb;
    greatest_info.msg = "res == TINF_OK && dlen == 0";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    res = -1;
  }
  return res;
}

Assistant:

TEST inflate_padding(void)
{
	/* Empty buffer, fixed, 6 bits of padding in the second byte set to 1 */
	static const unsigned char data[] = {
		0x03, 0xFC
	};
	unsigned int dlen = 0;
	int res;

	res = tinf_uncompress((void *) robuffer, &dlen, data, ARRAY_SIZE(data));

	ASSERT(res == TINF_OK && dlen == 0);

	PASS();
}